

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O0

void __thiscall
hedg::Publisher::Publisher
          (Publisher *this,MarketGenerator *market_gen,
          unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *handler,
          io_service *service,context *context,int max_markets,int time_span)

{
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  local_70;
  int local_68;
  value_type local_64;
  undefined1 local_60 [4];
  int i;
  int local_34;
  context *pcStack_30;
  int max_markets_local;
  context *context_local;
  io_service *service_local;
  unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *handler_local;
  MarketGenerator *market_gen_local;
  Publisher *this_local;
  
  local_34 = max_markets;
  pcStack_30 = context;
  context_local = (context *)service;
  service_local = (io_service *)handler;
  handler_local =
       (unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *)market_gen;
  market_gen_local = (MarketGenerator *)this;
  std::mutex::mutex(&this->mut_);
  std::condition_variable::condition_variable(&this->data_cond_);
  this->market_gen_ = (MarketGenerator *)handler_local;
  this->handler_ =
       (unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *)service_local
  ;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&this->free_socks_);
  std::
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ::vector(&this->socks);
  std::deque<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>::deque(&this->sock_flags);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,std::default_delete<hedg::Client<hedg::Stream_Client>>>
  ::unique_ptr<std::default_delete<hedg::Client<hedg::Stream_Client>>,void>
            ((unique_ptr<hedg::Client<hedg::Stream_Client>,std::default_delete<hedg::Client<hedg::Stream_Client>>>
              *)&this->order_socket_);
  std::
  deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ::deque(&this->subscribed_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::unordered_map(&this->last_ids);
  this->max_markets_ = local_34;
  this->time_span_ = time_span;
  utils::create_streamers
            ((vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
              *)local_60,(io_service *)context_local,pcStack_30,this->max_markets_);
  std::
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ::operator=(&this->socks,
              (vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
               *)local_60);
  std::
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ::~vector((vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
             *)local_60);
  for (local_64 = 0; local_64 < this->max_markets_; local_64 = local_64 + 1) {
    local_68 = 0;
    std::deque<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>::emplace_back<int>
              (&this->sock_flags,&local_68);
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->free_socks_,&local_64);
  }
  utils::new_streamer((utils *)&local_70,(io_service *)context_local,pcStack_30);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::operator=(&this->order_socket_,&local_70);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::~unique_ptr(&local_70);
  std::atomic<bool>::operator=(&this->order_socket_flag,false);
  return;
}

Assistant:

Publisher::Publisher(MarketGenerator& market_gen, std::unique_ptr<Market_Handler>& handler, 
	io_service& service, ssl::context& context, int max_markets, int time_span) :
	market_gen_{ market_gen }, handler_{ handler }, max_markets_{ max_markets }, time_span_{ time_span } {
	socks = utils::create_streamers(service, context, max_markets_);

	for (int i = 0; i < max_markets_; ++i) {
		sock_flags.emplace_back(0);
		free_socks_.push(i);
	}
	order_socket_ = utils::new_streamer(service, context);
	order_socket_flag = 0;
	
}